

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

string * __thiscall
hdc::CppPrinter::print_abi_cxx11_(string *__return_storage_ptr__,CppPrinter *this)

{
  string asStack_38 [32];
  
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string CppPrinter::print() {
    std::cout << output.str();
    return output.str();
}